

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

bool cppwinrt::is_add_overload(MethodDef *method)

{
  bool bVar1;
  bool local_31;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  string_view local_20;
  MethodDef *local_10;
  MethodDef *method_local;
  
  local_10 = method;
  bVar1 = winmd::reader::MethodDef::SpecialName(method);
  local_31 = false;
  if (bVar1) {
    local_20 = winmd::reader::MethodDef::Name(local_10);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"add_");
    local_31 = starts_with(&local_20,&local_30);
  }
  return local_31;
}

Assistant:

static bool is_add_overload(MethodDef const& method)
    {
        return method.SpecialName() && starts_with(method.Name(), "add_");
    }